

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.hpp
# Opt level: O0

void yactfr::internal::Vm::_setDataElemFromInstr<yactfr::DynamicLengthBlobBeginningElement>
               (DynamicLengthBlobBeginningElement *elem,Instr *instr)

{
  bool bVar1;
  DataType *pDVar2;
  StructureMemberType *pSVar3;
  bool local_21;
  ReadDataInstr *readDataInstr;
  Instr *instr_local;
  DynamicLengthBlobBeginningElement *elem_local;
  
  bVar1 = Instr::isBeginReadData(instr);
  local_21 = true;
  if (!bVar1) {
    local_21 = Instr::isEndReadData(instr);
  }
  if (local_21 == false) {
    __assert_fail("instr.isBeginReadData() || instr.isEndReadData()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/vm.hpp"
                  ,0x592,
                  "static void yactfr::internal::Vm::_setDataElemFromInstr(ElemT &, const Instr &) [ElemT = yactfr::DynamicLengthBlobBeginningElement]"
                 );
  }
  pDVar2 = ReadDataInstr::dt((ReadDataInstr *)instr);
  (elem->super_BlobBeginningElement).super_DataElement._dt = pDVar2;
  pSVar3 = ReadDataInstr::memberType((ReadDataInstr *)instr);
  (elem->super_BlobBeginningElement).super_DataElement._structMemberType = pSVar3;
  return;
}

Assistant:

static void _setDataElemFromInstr(ElemT& elem, const Instr& instr) noexcept
    {
        assert(instr.isBeginReadData() || instr.isEndReadData());

        auto& readDataInstr = static_cast<const ReadDataInstr&>(instr);

        elem._dt = &readDataInstr.dt();
        elem._structMemberType = readDataInstr.memberType();
    }